

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_psbt.cpp
# Opt level: O0

int CfdGetPsbtPubkeyRecord
              (void *handle,void *psbt_handle,int kind,uint32_t index,char *pubkey,char **value)

{
  undefined8 uVar1;
  string *psVar2;
  char *pcVar3;
  uint32_t in_ECX;
  int in_EDX;
  long in_RSI;
  long in_R8;
  undefined8 *in_R9;
  NetType in_stack_0000004c;
  char *in_stack_00000050;
  int in_stack_0000005c;
  CfdException *except;
  exception *std_except;
  ByteData data;
  ByteData key;
  KeyData pk_obj;
  CfdCapiPsbtHandle *psbt_obj;
  int result;
  ByteData *in_stack_fffffffffffffa98;
  KeyData *in_stack_fffffffffffffaa0;
  string *in_stack_fffffffffffffab0;
  undefined8 in_stack_fffffffffffffab8;
  CfdError error_code;
  allocator *paVar4;
  CfdException *in_stack_fffffffffffffac0;
  string local_4a8;
  undefined1 local_482;
  allocator local_481;
  string local_480 [32];
  char *local_460;
  int in_stack_fffffffffffffba8;
  undefined4 in_stack_fffffffffffffbac;
  char *in_stack_fffffffffffffbb0;
  ByteData local_448;
  ExtPubkey local_430;
  ByteData local_3c0;
  ByteData local_3a8;
  ByteData local_390;
  Pubkey local_378;
  ByteData local_360;
  ByteData local_348;
  Pubkey local_330;
  ByteData local_318;
  ByteData local_300;
  Pubkey local_2e8;
  ByteData local_2d0;
  ByteData local_2b8;
  ByteData local_2a0;
  KeyData local_288;
  undefined1 local_132;
  allocator local_131;
  string local_130 [32];
  CfdSourceLocation local_110;
  undefined1 local_f2;
  allocator local_f1;
  string local_f0 [32];
  CfdSourceLocation local_d0;
  undefined1 local_b2;
  allocator local_b1;
  string local_b0 [32];
  CfdSourceLocation local_90;
  long local_78;
  allocator local_69;
  string local_68 [52];
  undefined4 local_34;
  undefined8 *local_30;
  long local_28;
  uint32_t local_20;
  int local_1c;
  long local_18;
  int local_4;
  
  error_code = (CfdError)((ulong)in_stack_fffffffffffffab8 >> 0x20);
  local_34 = 0xffffffff;
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_ECX;
  local_1c = in_EDX;
  local_18 = in_RSI;
  cfd::Initialize();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_68,"PsbtHandle",&local_69);
  cfd::capi::CheckBuffer
            (in_stack_fffffffffffffbb0,
             (string *)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  local_78 = local_18;
  if (local_28 == 0) {
    local_90.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_psbt.cpp"
                 ,0x2f);
    local_90.filename = local_90.filename + 1;
    local_90.line = 0x5fc;
    local_90.funcname = "CfdGetPsbtPubkeyRecord";
    cfd::core::logger::warn<>(&local_90,"pubkey is null.");
    local_b2 = 1;
    uVar1 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_b0,"Failed to parameter. pubkey is null.",&local_b1);
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffffac0,error_code,in_stack_fffffffffffffab0);
    local_b2 = 0;
    __cxa_throw(uVar1,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (local_30 != (undefined8 *)0x0) {
    if (*(long *)(local_18 + 0x18) != 0) {
      cfd::capi::ParsePubkey(in_stack_0000005c,in_stack_00000050,in_stack_0000004c);
      cfd::core::ByteData::ByteData(&local_2a0);
      cfd::core::ByteData::ByteData(&local_2b8);
      psVar2 = (string *)(ulong)(local_1c - 1);
      switch(psVar2) {
      case (string *)0x0:
        cfd::core::KeyData::GetPubkey(&local_2e8,&local_288);
        cfd::core::Psbt::CreatePubkeyRecordKey(&local_2d0,'\x02',&local_2e8);
        cfd::core::ByteData::operator=
                  ((ByteData *)in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98);
        cfd::core::ByteData::~ByteData((ByteData *)0x5f6e3c);
        cfd::core::Pubkey::~Pubkey((Pubkey *)0x5f6e49);
        cfd::core::Psbt::GetTxInRecord(&local_300,*(Psbt **)(local_78 + 0x18),local_20,&local_2a0);
        cfd::core::ByteData::operator=
                  ((ByteData *)in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98);
        cfd::core::ByteData::~ByteData((ByteData *)0x5f6e92);
        break;
      case (string *)0x1:
        cfd::core::KeyData::GetPubkey(&local_330,&local_288);
        cfd::core::Psbt::CreatePubkeyRecordKey(&local_318,'\x06',&local_330);
        cfd::core::ByteData::operator=
                  ((ByteData *)in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98);
        cfd::core::ByteData::~ByteData((ByteData *)0x5f6f32);
        cfd::core::Pubkey::~Pubkey((Pubkey *)0x5f6f3f);
        cfd::core::Psbt::GetTxInRecord(&local_348,*(Psbt **)(local_78 + 0x18),local_20,&local_2a0);
        cfd::core::ByteData::operator=
                  ((ByteData *)in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98);
        cfd::core::ByteData::~ByteData((ByteData *)0x5f6f88);
        break;
      case (string *)0x2:
        cfd::core::KeyData::GetPubkey(&local_378,&local_288);
        cfd::core::Psbt::CreatePubkeyRecordKey(&local_360,'\x02',&local_378);
        cfd::core::ByteData::operator=
                  ((ByteData *)in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98);
        cfd::core::ByteData::~ByteData((ByteData *)0x5f700f);
        cfd::core::Pubkey::~Pubkey((Pubkey *)0x5f701c);
        cfd::core::Psbt::GetTxOutRecord(&local_390,*(Psbt **)(local_78 + 0x18),local_20,&local_2a0);
        cfd::core::ByteData::operator=
                  ((ByteData *)in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98);
        cfd::core::ByteData::~ByteData((ByteData *)0x5f7065);
        break;
      case (string *)0x3:
        cfd::core::KeyData::GetExtPubkey(&local_430,&local_288);
        cfd::core::ExtPubkey::GetData(&local_3c0,&local_430);
        cfd::core::Psbt::CreateFixRecordKey(&local_3a8,'\x01',&local_3c0);
        cfd::core::ByteData::operator=
                  ((ByteData *)in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98);
        cfd::core::ByteData::~ByteData((ByteData *)0x5f7103);
        cfd::core::ByteData::~ByteData((ByteData *)0x5f7110);
        cfd::core::ExtPubkey::~ExtPubkey((ExtPubkey *)in_stack_fffffffffffffaa0);
        cfd::core::Psbt::GetGlobalRecord(&local_448,*(Psbt **)(local_78 + 0x18),&local_2a0);
        cfd::core::ByteData::operator=
                  ((ByteData *)in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98);
        cfd::core::ByteData::~ByteData((ByteData *)0x5f715f);
        break;
      default:
        local_460 = strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_psbt.cpp"
                            ,0x2f);
        local_460 = local_460 + 1;
        cfd::core::logger::warn<int&>
                  ((CfdSourceLocation *)&local_460,"kind is invalid: {}",&local_1c);
        local_482 = 1;
        psVar2 = (string *)__cxa_allocate_exception(0x30);
        paVar4 = &local_481;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_480,"Failed to parameter. kind is invalid.",paVar4);
        cfd::core::CfdException::CfdException
                  (in_stack_fffffffffffffac0,(CfdError)((ulong)paVar4 >> 0x20),psVar2);
        local_482 = 0;
        __cxa_throw(psVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException
                   );
      }
      cfd::core::ByteData::GetHex_abi_cxx11_(&local_4a8,&local_2b8);
      pcVar3 = cfd::capi::CreateString(psVar2);
      *local_30 = pcVar3;
      std::__cxx11::string::~string((string *)&local_4a8);
      local_4 = 0;
      cfd::core::ByteData::~ByteData((ByteData *)0x5f7342);
      cfd::core::ByteData::~ByteData((ByteData *)0x5f734f);
      cfd::core::KeyData::~KeyData(in_stack_fffffffffffffaa0);
      return local_4;
    }
    local_110.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_psbt.cpp"
                 ,0x2f);
    local_110.filename = local_110.filename + 1;
    local_110.line = 0x608;
    local_110.funcname = "CfdGetPsbtPubkeyRecord";
    cfd::core::logger::warn<>(&local_110,"psbt is null.");
    local_132 = 1;
    uVar1 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_130,"Failed to handle statement. psbt is null.",&local_131);
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffffac0,error_code,in_stack_fffffffffffffab0);
    local_132 = 0;
    __cxa_throw(uVar1,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  local_d0.filename =
       strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_psbt.cpp"
               ,0x2f);
  local_d0.filename = local_d0.filename + 1;
  local_d0.line = 0x602;
  local_d0.funcname = "CfdGetPsbtPubkeyRecord";
  cfd::core::logger::warn<>(&local_d0,"value is null.");
  local_f2 = 1;
  uVar1 = __cxa_allocate_exception(0x30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f0,"Failed to parameter. value is null.",&local_f1);
  cfd::core::CfdException::CfdException
            (in_stack_fffffffffffffac0,error_code,in_stack_fffffffffffffab0);
  local_f2 = 0;
  __cxa_throw(uVar1,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdGetPsbtPubkeyRecord(
    void* handle, void* psbt_handle, int kind, uint32_t index,
    const char* pubkey, char** value) {
  int result = CfdErrorCode::kCfdUnknownError;
  try {
    cfd::Initialize();
    CheckBuffer(psbt_handle, kPrefixPsbtHandle);
    CfdCapiPsbtHandle* psbt_obj = static_cast<CfdCapiPsbtHandle*>(psbt_handle);
    if (pubkey == nullptr) {
      warn(CFD_LOG_SOURCE, "pubkey is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. pubkey is null.");
    }
    if (value == nullptr) {
      warn(CFD_LOG_SOURCE, "value is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. value is null.");
    }
    if (psbt_obj->psbt == nullptr) {
      warn(CFD_LOG_SOURCE, "psbt is null.");
      throw CfdException(
          CfdError::kCfdIllegalStateError,
          "Failed to handle statement. psbt is null.");
    }

    KeyData pk_obj = ParsePubkey(kind, pubkey, psbt_obj->net_type);
    ByteData key;
    ByteData data;
    switch (kind) {
      case kCfdPsbtRecordInputSignature:
        key = Psbt::CreatePubkeyRecordKey(
            Psbt::kPsbtInputPartialSig, pk_obj.GetPubkey());
        data = psbt_obj->psbt->GetTxInRecord(index, key);
        break;
      case kCfdPsbtRecordInputBip32:
        key = Psbt::CreatePubkeyRecordKey(
            Psbt::kPsbtInputBip32Derivation, pk_obj.GetPubkey());
        data = psbt_obj->psbt->GetTxInRecord(index, key);
        break;
      case kCfdPsbtRecordOutputBip32:
        key = Psbt::CreatePubkeyRecordKey(
            Psbt::kPsbtOutputBip32Derivation, pk_obj.GetPubkey());
        data = psbt_obj->psbt->GetTxOutRecord(index, key);
        break;
      case kCfdPsbtRecordGloalXpub:
        key = Psbt::CreateFixRecordKey(
            Psbt::kPsbtGlobalXpub, pk_obj.GetExtPubkey().GetData());
        data = psbt_obj->psbt->GetGlobalRecord(key);
        break;
      default:
        warn(CFD_LOG_SOURCE, "kind is invalid: {}", kind);
        throw CfdException(
            CfdError::kCfdIllegalArgumentError,
            "Failed to parameter. kind is invalid.");
    }

    *value = CreateString(data.GetHex());
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  return result;
}